

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::UnicodeString::setToUTF8(UnicodeString *this,StringPiece utf8)

{
  undefined8 in_RAX;
  char16_t *dest;
  int srcLength;
  int32_t destCapacity;
  int minCapacity;
  UErrorCode errorCode;
  int32_t length16;
  
  length16 = (int32_t)((ulong)in_RAX >> 0x20);
  srcLength = utf8.length_;
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0) {
    (this->fUnion).fStackFields.fLengthAndFlags = 2;
  }
  destCapacity = 0x1b;
  minCapacity = srcLength + 1;
  if (srcLength < 0x1c) {
    minCapacity = destCapacity;
  }
  dest = getBuffer(this,minCapacity);
  errorCode = U_ZERO_ERROR;
  if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
    destCapacity = (this->fUnion).fFields.fCapacity;
  }
  u_strFromUTF8WithSub_63
            (dest,destCapacity,&length16,utf8.ptr_,srcLength,0xfffd,(int32_t *)0x0,&errorCode);
  releaseBuffer(this,length16);
  if (U_ZERO_ERROR < errorCode) {
    setToBogus(this);
  }
  return this;
}

Assistant:

UnicodeString &UnicodeString::setToUTF8(StringPiece utf8) {
  unBogus();
  int32_t length = utf8.length();
  int32_t capacity;
  // The UTF-16 string will be at most as long as the UTF-8 string.
  if(length <= US_STACKBUF_SIZE) {
    capacity = US_STACKBUF_SIZE;
  } else {
    capacity = length + 1;  // +1 for the terminating NUL.
  }
  UChar *utf16 = getBuffer(capacity);
  int32_t length16;
  UErrorCode errorCode = U_ZERO_ERROR;
  u_strFromUTF8WithSub(utf16, getCapacity(), &length16,
      utf8.data(), length,
      0xfffd,  // Substitution character.
      NULL,    // Don't care about number of substitutions.
      &errorCode);
  releaseBuffer(length16);
  if(U_FAILURE(errorCode)) {
    setToBogus();
  }
  return *this;
}